

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# despot.cpp
# Opt level: O0

VNode * despot::DESPOT::SelectBestWEUNode(QNode *qnode)

{
  VNode *vnode_00;
  bool bVar1;
  pointer ppVar2;
  VNode *pVVar3;
  double weu;
  VNode *vnode;
  _Self local_30;
  iterator it;
  map<unsigned_long,_despot::VNode_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_despot::VNode_*>_>_>
  *children;
  VNode *vstar;
  double weustar;
  QNode *qnode_local;
  
  vstar = (VNode *)0xfff0000000000000;
  children = (map<unsigned_long,_despot::VNode_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_despot::VNode_*>_>_>
              *)0x0;
  it._M_node = (_Base_ptr)QNode::children(qnode);
  local_30._M_node =
       (_Base_ptr)
       std::
       map<unsigned_long,_despot::VNode_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_despot::VNode_*>_>_>
       ::begin((map<unsigned_long,_despot::VNode_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_despot::VNode_*>_>_>
                *)it._M_node);
  while( true ) {
    vnode = (VNode *)std::
                     map<unsigned_long,_despot::VNode_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_despot::VNode_*>_>_>
                     ::end((map<unsigned_long,_despot::VNode_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_despot::VNode_*>_>_>
                            *)it._M_node);
    bVar1 = std::operator!=(&local_30,(_Self *)&vnode);
    if (!bVar1) break;
    ppVar2 = std::_Rb_tree_iterator<std::pair<const_unsigned_long,_despot::VNode_*>_>::operator->
                       (&local_30);
    vnode_00 = ppVar2->second;
    pVVar3 = (VNode *)WEU(vnode_00);
    if ((double)vstar <= (double)pVVar3) {
      children = (map<unsigned_long,_despot::VNode_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_despot::VNode_*>_>_>
                  *)vnode_00->vstar;
      vstar = pVVar3;
    }
    std::_Rb_tree_iterator<std::pair<const_unsigned_long,_despot::VNode_*>_>::operator++
              (&local_30,0);
  }
  return (VNode *)children;
}

Assistant:

VNode* DESPOT::SelectBestWEUNode(QNode* qnode) {
	double weustar = Globals::NEG_INFTY;
	VNode* vstar = NULL;
	map<OBS_TYPE, VNode*>& children = qnode->children();
	for (map<OBS_TYPE, VNode*>::iterator it = children.begin();
		it != children.end(); it++) {
		VNode* vnode = it->second;

		double weu = WEU(vnode);
		if (weu >= weustar) {
			weustar = weu;
			vstar = vnode->vstar;
		}
	}
	return vstar;
}